

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *
vkt::wsi::anon_unknown_0::createWindow
          (MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *__return_storage_ptr__,
          Display *display,Maybe<tcu::Vector<unsigned_int,_2>_> *initialSize)

{
  undefined8 uVar1;
  NotSupportedError *e;
  Maybe<tcu::Vector<unsigned_int,_2>_> *local_20;
  Maybe<tcu::Vector<unsigned_int,_2>_> *initialSize_local;
  Display *display_local;
  
  local_20 = initialSize;
  initialSize_local = (Maybe<tcu::Vector<unsigned_int,_2>_> *)display;
  display_local = (Display *)__return_storage_ptr__;
  uVar1 = (**(code **)(*(long *)display + 0x10))(display,initialSize);
  de::DefaultDeleter<vk::wsi::Window>::DefaultDeleter
            ((DefaultDeleter<vk::wsi::Window> *)((long)&e + 3));
  de::details::MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::MovePtr
            (__return_storage_ptr__,uVar1);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Window> createWindow (const Display& display, const Maybe<UVec2>& initialSize)
{
	try
	{
		return MovePtr<Window>(display.createWindow(initialSize));
	}
	catch (const tcu::NotSupportedError& e)
	{
		// See createDisplay - assuming that wsi::Display was supported platform port
		// should also support creating a window.
		throw tcu::TestError(e.getMessage());
	}
}